

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

ArrayPtr<capnp::word> __thiscall
capnp::SchemaLoader::Impl::rewriteStructNodeWithSizes
          (Impl *this,Reader node,uint dataWordCount,uint pointerCount)

{
  size_t amount;
  ushort uVar1;
  uint uVar2;
  size_t sVar3;
  word *pwVar4;
  MessageSizeCounts MVar5;
  ArrayPtr<capnp::word> AVar6;
  ArrayPtr<capnp::word> uncheckedBuffer;
  Builder root;
  MallocMessageBuilder builder;
  Builder local_1b0;
  StructReader local_198;
  SegmentReader *local_168;
  CapTableReader *pCStack_160;
  void *local_158;
  WirePointer *pWStack_150;
  StructDataBitCount local_148;
  StructPointerCount SStack_144;
  undefined2 uStack_142;
  int iStack_140;
  undefined4 uStack_13c;
  StructBuilder local_138;
  MallocMessageBuilder local_110;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_110,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_1b0,&local_110.super_MessageBuilder);
  local_198.dataSize = node._reader.dataSize;
  local_198.pointerCount = node._reader.pointerCount;
  local_198._38_2_ = node._reader._38_2_;
  local_198.nestingLimit = node._reader.nestingLimit;
  local_198._44_4_ = node._reader._44_4_;
  local_198.data = node._reader.data;
  local_198.pointers = node._reader.pointers;
  local_198.segment = node._reader.segment;
  local_198.capTable = node._reader.capTable;
  local_138.data = local_1b0.builder.pointer;
  local_138.segment = local_1b0.builder.segment;
  local_138.capTable = local_1b0.builder.capTable;
  capnp::_::PointerBuilder::setStruct((PointerBuilder *)&local_138,&local_198,false);
  MessageBuilder::getRootInternal(&local_1b0,&local_110.super_MessageBuilder);
  local_198.data = local_1b0.builder.pointer;
  local_198.segment = &(local_1b0.builder.segment)->super_SegmentReader;
  local_198.capTable = &(local_1b0.builder.capTable)->super_CapTableReader;
  capnp::_::PointerBuilder::getStruct
            (&local_138,(PointerBuilder *)&local_198,(StructSize)0x60006,(word *)0x0);
  uVar1 = *(ushort *)((long)&((WirePointer *)((long)local_138.data + 8))->field_1 + 2);
  uVar2 = (uint)uVar1;
  if (uVar1 < dataWordCount) {
    uVar2 = dataWordCount;
  }
  (((WirePointer *)((long)local_138.data + 8))->field_1).structRef.ptrCount.value =
       (unsigned_short)uVar2;
  uVar1 = (ushort)(((WirePointer *)((long)local_138.data + 0x18))->offsetAndKind).value;
  uVar2 = (uint)uVar1;
  if (uVar1 < pointerCount) {
    uVar2 = pointerCount;
  }
  *(short *)&(((WirePointer *)((long)local_138.data + 0x18))->offsetAndKind).value = (short)uVar2;
  capnp::_::StructBuilder::asReader(&local_138);
  local_198.dataSize = local_148;
  local_198.pointerCount = SStack_144;
  local_198._38_2_ = uStack_142;
  local_198.nestingLimit = iStack_140;
  local_198._44_4_ = uStack_13c;
  local_198.data = local_158;
  local_198.pointers = pWStack_150;
  local_198.segment = local_168;
  local_198.capTable = pCStack_160;
  MVar5 = capnp::_::StructReader::totalSize(&local_198);
  amount = MVar5.wordCount * 8 + 8;
  sVar3 = 0;
  AVar6.ptr = (Reader *)kj::Arena::allocateBytes(&this->arena,amount,8,false);
  pwVar4 = (word *)(MVar5.wordCount + 1);
  memset(AVar6.ptr,0,amount);
  uncheckedBuffer.size_ = sVar3;
  uncheckedBuffer.ptr = pwVar4;
  copyToUnchecked<capnp::schema::Node::Reader&>((capnp *)&local_198,AVar6.ptr,uncheckedBuffer);
  MallocMessageBuilder::~MallocMessageBuilder(&local_110);
  AVar6.size_ = (size_t)pwVar4;
  return AVar6;
}

Assistant:

kj::ArrayPtr<word> SchemaLoader::Impl::rewriteStructNodeWithSizes(
    schema::Node::Reader node, uint dataWordCount, uint pointerCount) {
  MallocMessageBuilder builder;
  builder.setRoot(node);

  auto root = builder.getRoot<schema::Node>();
  auto newStruct = root.getStruct();
  newStruct.setDataWordCount(kj::max(newStruct.getDataWordCount(), dataWordCount));
  newStruct.setPointerCount(kj::max(newStruct.getPointerCount(), pointerCount));

  return makeUncheckedNode(root);
}